

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

ON_SubDMeshFragment * __thiscall ON_SubDMeshFragment::LastFaceFragment(ON_SubDMeshFragment *this)

{
  ushort uVar1;
  bool bVar2;
  ON_SubDMeshFragment *this_00;
  
  bVar2 = IsFullFaceFragment(this);
  if (bVar2) {
    return this;
  }
  bVar2 = IsFaceCornerFragment(this);
  if (bVar2) {
    uVar1 = this->m_face_fragment_count;
    for (; this != (ON_SubDMeshFragment *)0x0; this = NextFaceFragment(this,false)) {
      this_00 = this;
      if ((uint)uVar1 <= this->m_face_fragment_index + 1) {
        do {
          this_00 = PreviousFaceFragment(this_00,false);
          if (this_00 == (ON_SubDMeshFragment *)0x0) {
            return (ON_SubDMeshFragment *)0x0;
          }
        } while (this_00->m_face_fragment_index != 0);
        return this;
      }
    }
  }
  return (ON_SubDMeshFragment *)0x0;
}

Assistant:

const ON_SubDMeshFragment* ON_SubDMeshFragment::LastFaceFragment() const
{
  if (IsFullFaceFragment())
    return this;
  if (false == IsFaceCornerFragment())
    return nullptr;

  const ON_SubDMeshFragment* last = this;
  while (nullptr != last && last->m_face_fragment_index + 1 < m_face_fragment_count)
    last = last->NextFaceFragment(false);
  if (nullptr == last)
    return nullptr;
  const ON_SubDMeshFragment* first = last->PreviousFaceFragment(false);
  while (nullptr != first && first->m_face_fragment_index > 0)
    first = first->PreviousFaceFragment(false);
  if (nullptr == first)
    return nullptr;
  return last;
}